

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O3

int uv_fs_poll_stop(uv_fs_poll_t *handle)

{
  uint *puVar1;
  uint uVar2;
  long *plVar3;
  int iVar4;
  
  iVar4 = uv_is_active((uv_handle_t *)handle);
  if (iVar4 != 0) {
    plVar3 = (long *)handle->poll_ctx;
    if (plVar3 == (long *)0x0) {
      __assert_fail("ctx != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/fs-poll.c"
                    ,0x7b,"int uv_fs_poll_stop(uv_fs_poll_t *)");
    }
    if ((uv_fs_poll_t *)*plVar3 != handle) {
      __assert_fail("ctx->parent_handle == handle",
                    "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/fs-poll.c"
                    ,0x7c,"int uv_fs_poll_stop(uv_fs_poll_t *)");
    }
    iVar4 = uv_is_active((uv_handle_t *)(plVar3 + 5));
    if (iVar4 != 0) {
      uv_close((uv_handle_t *)(plVar3 + 5),timer_close_cb,(void *)0x0);
    }
    uVar2 = handle->flags;
    if (((uVar2 & 4) != 0) && (handle->flags = uVar2 & 0xfffffffb, (uVar2 & 8) != 0)) {
      puVar1 = &handle->loop->active_handles;
      *puVar1 = *puVar1 - 1;
    }
  }
  return 0;
}

Assistant:

int uv_fs_poll_stop(uv_fs_poll_t* handle) {
  struct poll_ctx* ctx;

  if (!uv_is_active((uv_handle_t*)handle))
    return 0;

  ctx = handle->poll_ctx;
  assert(ctx != NULL);
  assert(ctx->parent_handle == handle);

  /* Close the timer if it's active. If it's inactive, there's a stat request
   * in progress and poll_cb will take care of the cleanup.
   */
  if (uv_is_active((uv_handle_t*)&ctx->timer_handle))
    uv_close((uv_handle_t*)&ctx->timer_handle, timer_close_cb, NULL);

  uv__handle_stop(handle);

  return 0;
}